

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O1

errr finish_parse_class(parser *p)

{
  player_class *ppVar1;
  player_class *ppVar2;
  uint uVar3;
  
  ppVar1 = (player_class *)parser_priv(p);
  uVar3 = 0;
  for (ppVar2 = ppVar1; classes = ppVar1, ppVar2 != (player_class *)0x0; ppVar2 = ppVar2->next) {
    uVar3 = uVar3 + 1;
  }
  while( true ) {
    if (ppVar1 == (player_class *)0x0) {
      parser_destroy(p);
      return 0;
    }
    uVar3 = uVar3 - 1;
    if (uVar3 == 0xffffffff) break;
    ppVar1->cidx = uVar3;
    ppVar1 = ppVar1->next;
  }
  __assert_fail("num",
                "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/init.c"
                ,0x10e8,"errr finish_parse_class(struct parser *)");
}

Assistant:

static errr finish_parse_class(struct parser *p) {
	struct player_class *c;
	int num = 0;
	classes = parser_priv(p);
	for (c = classes; c; c = c->next) num++;
	for (c = classes; c; c = c->next, num--) {
		assert(num);
		c->cidx = num - 1;
	}
	parser_destroy(p);
	return 0;
}